

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::cancelGesturesForChildren(QGraphicsScenePrivate *this,QGesture *original)

{
  QHash<QGesture_*,_QGraphicsObject_*> *this_00;
  QGesture **ppQVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Span *pSVar4;
  QGesture *gesture;
  QGraphicsItemPrivate *pQVar5;
  QGestureManager *this_01;
  QGraphicsItem **ppQVar6;
  bool bVar7;
  Representation RVar8;
  QGraphicsObject *pQVar9;
  QGraphicsObject *pQVar10;
  uint uVar11;
  ulong uVar12;
  QGesture **ppQVar13;
  long lVar14;
  QGraphicsItem *pQVar15;
  long lVar16;
  long in_FS_OFFSET;
  QGestureEvent ev_1;
  QGestureEvent ev;
  undefined1 local_158 [12];
  char cStack_14c;
  Data *local_148;
  QGesture **ppQStack_140;
  undefined1 *local_138;
  QWidget *pQStack_130;
  QMap<Qt::GestureType,_bool> local_128;
  QMap<Qt::GestureType,_QWidget_*> QStack_120;
  QArrayDataPointer<QGesture_*> local_118;
  QArrayDataPointer<QGraphicsItem_*> local_f8;
  undefined1 *local_d8;
  undefined8 uStack_d0;
  Data *local_c8;
  QGesture **ppQStack_c0;
  undefined1 *local_b8;
  QWidget *pQStack_b0;
  QMap<Qt::GestureType,_bool> local_a8;
  QMap<Qt::GestureType,_QWidget_*> QStack_a0;
  QArrayDataPointer<QGesture_*> local_98;
  QHash<QGesture_*,_QHashDummyValue> local_80;
  piter local_78;
  QHash<QGesture_*,_QHashDummyValue> local_60;
  piter local_58;
  QHash<QGesture_*,_QHashDummyValue> local_48;
  QGesture *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->gestureTargets;
  local_40 = original;
  pQVar9 = QHash<QGesture_*,_QGraphicsObject_*>::value(this_00,&local_40);
  if (pQVar9 != (QGraphicsObject *)0x0) {
    local_48.d = (Data *)0x0;
    local_58 = (piter)QHash<QGesture_*,_QGraphicsObject_*>::begin(this_00);
    while( true ) {
      if (local_58.d == (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0 &&
          local_58.bucket == 0) break;
      pSVar2 = (local_58.d)->spans;
      uVar12 = local_58.bucket >> 7;
      lVar14 = *(long *)(pSVar2[uVar12].entries
                         [pSVar2[uVar12].offsets[(uint)local_58.bucket & 0x7f]].storage.data + 8);
      pQVar15 = (QGraphicsItem *)(lVar14 + 0x10);
      if (lVar14 == 0) {
        pQVar15 = (QGraphicsItem *)0x0;
      }
      if ((pQVar15 != &pQVar9->super_QGraphicsItem) &&
         (bVar7 = QGraphicsItem::isAncestorOf(&pQVar9->super_QGraphicsItem,pQVar15), bVar7)) {
        pSVar2 = (local_58.d)->spans;
        uVar12 = local_58.bucket >> 7;
        uVar11 = (uint)local_58.bucket & 0x7f;
        pEVar3 = pSVar2[uVar12].entries;
        *(undefined4 *)
         (*(long *)(*(long *)pEVar3[pSVar2[uVar12].offsets[uVar11]].storage.data + 8) + 0x7c) = 4;
        QSet<QGesture_*>::operator<<
                  ((QSet<QGesture_*> *)&local_48,
                   (QGesture **)(pEVar3 + pSVar2[uVar12].offsets[uVar11]));
      }
      QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::operator++
                (&local_58);
    }
    local_60.d = local_48.d;
    if ((local_48.d != (Data *)0x0) &&
       (((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78 = (piter)ZEXT816(0);
    while( true ) {
      if ((local_60.d == (Data *)0x0) || ((local_60.d)->size == 0)) break;
      local_80.d = (Data *)0x0;
      local_78 = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&local_60);
      pQVar9 = (QGraphicsObject *)0x0;
      while( true ) {
        if (local_78.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
            local_78.bucket == 0) break;
        pSVar4 = (local_78.d)->spans;
        uVar12 = local_78.bucket >> 7;
        pQVar10 = QHash<QGesture_*,_QGraphicsObject_*>::value
                            (this_00,(QGesture **)
                                     (pSVar4[uVar12].entries +
                                     pSVar4[uVar12].offsets[(uint)local_78.bucket & 0x7f]));
        if (pQVar9 == (QGraphicsObject *)0x0) {
          pQVar9 = pQVar10;
        }
        if (pQVar9 == pQVar10) {
          QSet<QGesture_*>::operator<<
                    ((QSet<QGesture_*> *)&local_80,
                     (QGesture **)
                     ((local_78.d)->spans[local_78.bucket >> 7].entries +
                     (local_78.d)->spans[local_78.bucket >> 7].offsets[(uint)local_78.bucket & 0x7f]
                     ));
          local_78 = (piter)QHash<QGesture_*,_QHashDummyValue>::erase
                                      (&local_60,(const_iterator)local_78);
        }
        else {
          QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                    (&local_78);
        }
      }
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::values((QList<QGesture_*> *)&local_98,(QSet<QGesture_*> *)&local_80);
      local_a8.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
            )&DAT_aaaaaaaaaaaaaaaa;
      QStack_a0.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
            )&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_b0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      ppQStack_c0 = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      QGestureEvent::QGestureEvent((QGestureEvent *)&local_d8,(QList<QGesture_*> *)&local_98);
      pQVar15 = &pQVar9->super_QGraphicsItem;
      if (pQVar9 == (QGraphicsObject *)0x0) {
        pQVar15 = (QGraphicsItem *)0x0;
      }
      sendEvent(this,pQVar15,(QEvent *)&local_d8);
      if (uStack_d0._4_1_ == '\0') {
        ppQVar1 = local_98.ptr + local_98.size;
        for (ppQVar13 = local_98.ptr; ppQVar13 != ppQVar1; ppQVar13 = ppQVar13 + 1) {
          gesture = *ppQVar13;
          bVar7 = QGestureEvent::isAccepted((QGestureEvent *)&local_d8,gesture);
          if ((!bVar7) && (bVar7 = QGesture::hasHotSpot(gesture), bVar7)) {
            local_158._0_4_ = 0;
            local_158._4_4_ = 0;
            local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_f8.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            itemsAtPosition((QList<QGraphicsItem_*> *)&local_f8,this,(QPoint *)local_158,
                            (QPointF *)(*(long *)&gesture->field_0x8 + 0x90),(QWidget *)0x0);
            ppQVar6 = local_f8.ptr;
            lVar16 = local_f8.size << 3;
            for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 8) {
              pQVar9 = QGraphicsItem::toGraphicsObject(*(QGraphicsItem **)((long)ppQVar6 + lVar14));
              if (pQVar9 != (QGraphicsObject *)0x0) {
                pQVar5 = (pQVar9->super_QGraphicsItem).d_ptr.d;
                RVar8.m_i = QGesture::gestureType(gesture);
                local_158._0_4_ = RVar8.m_i;
                bVar7 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                  (&pQVar5->gestureContext,(GestureType *)local_158);
                if (bVar7) {
                  local_118.d = (Data *)0x0;
                  local_118.ptr = (QGesture **)0x0;
                  local_118.size = 0;
                  QList<QGesture_*>::append((QList<QGesture_*> *)&local_118,gesture);
                  local_128.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
                        )&DAT_aaaaaaaaaaaaaaaa;
                  QStack_120.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                        )&DAT_aaaaaaaaaaaaaaaa;
                  local_138 = &DAT_aaaaaaaaaaaaaaaa;
                  pQStack_130 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
                  local_148 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  ppQStack_140 = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
                  local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  stack0xfffffffffffffeb0 = &DAT_aaaaaaaaaaaaaaaa;
                  QGestureEvent::QGestureEvent
                            ((QGestureEvent *)local_158,(QList<QGesture_*> *)&local_118);
                  sendEvent(this,&pQVar9->super_QGraphicsItem,(QEvent *)local_158);
                  if (cStack_14c != '\0') {
                    QGestureEvent::~QGestureEvent((QGestureEvent *)local_158);
                    QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&local_118);
                    break;
                  }
                  bVar7 = QGestureEvent::isAccepted((QGestureEvent *)local_158,gesture);
                  QGestureEvent::~QGestureEvent((QGestureEvent *)local_158);
                  QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&local_118);
                  if (bVar7) break;
                }
              }
            }
            QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_f8);
          }
        }
      }
      QGestureEvent::~QGestureEvent((QGestureEvent *)&local_d8);
      QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&local_98);
      QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_80);
    }
    this_01 = QApplicationPrivate::self->gestureManager;
    local_78 = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&local_48);
    while( true ) {
      if (local_78.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
          local_78.bucket == 0) break;
      pSVar4 = (local_78.d)->spans;
      uVar12 = local_78.bucket >> 7;
      QGestureManager::recycle
                ((QGestureManager *)this_01,
                 *(QGesture **)
                  pSVar4[uVar12].entries[pSVar4[uVar12].offsets[(uint)local_78.bucket & 0x7f]].
                  storage.data);
      QHash<QGesture*,QGraphicsObject*>::removeImpl<QGesture*>
                ((QHash<QGesture*,QGraphicsObject*> *)this_00,
                 (QGesture **)
                 ((local_78.d)->spans[local_78.bucket >> 7].entries +
                 (local_78.d)->spans[local_78.bucket >> 7].offsets[(uint)local_78.bucket & 0x7f]));
      QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                (&local_78);
    }
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_60);
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::cancelGesturesForChildren(QGesture *original)
{
    Q_ASSERT(original);
    QGraphicsItem *originalItem = gestureTargets.value(original);
    if (originalItem == nullptr) // we only act on accepted gestures, which implies it has a target.
        return;

    // iterate over all active gestures and for each find the owner
    // if the owner is part of our sub-hierarchy, cancel it.

    QSet<QGesture *> canceledGestures;
    QHash<QGesture *, QGraphicsObject *>::Iterator iter = gestureTargets.begin();
    while (iter != gestureTargets.end()) {
        QGraphicsObject *item = iter.value();
        // note that we don't touch the gestures for our originalItem
        if (item != originalItem && originalItem->isAncestorOf(item)) {
            DEBUG() << "  found a gesture to cancel" << iter.key();
            iter.key()->d_func()->state = Qt::GestureCanceled;
            canceledGestures << iter.key();
        }
        ++iter;
    }

    // sort them per target item by cherry picking from almostCanceledGestures and delivering
    QSet<QGesture *> almostCanceledGestures = canceledGestures;
    QSet<QGesture *>::Iterator setIter;
    while (!almostCanceledGestures.isEmpty()) {
        QGraphicsObject *target = nullptr;
        QSet<QGesture*> gestures;
        setIter = almostCanceledGestures.begin();
        // sort per target item
        while (setIter != almostCanceledGestures.end()) {
            QGraphicsObject *item = gestureTargets.value(*setIter);
            if (target == nullptr)
                target = item;
            if (target == item) {
                gestures << *setIter;
                setIter = almostCanceledGestures.erase(setIter);
            } else {
                ++setIter;
            }
        }
        Q_ASSERT(target);

        const QList<QGesture *> list = gestures.values();
        QGestureEvent ev(list);
        sendEvent(target, &ev);

        if (!ev.isAccepted()) {
            for (QGesture *g : list) {

                if (ev.isAccepted(g))
                    continue;

                if (!g->hasHotSpot())
                    continue;

                const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), g->d_func()->sceneHotSpot, nullptr);
                for (const auto &item : items) {
                    QGraphicsObject *object = item->toGraphicsObject();
                    if (!object)
                        continue;
                    QGraphicsItemPrivate *d = object->QGraphicsItem::d_func();
                    if (d->gestureContext.contains(g->gestureType())) {
                        QList<QGesture *> list;
                        list << g;
                        QGestureEvent ev(list);
                        sendEvent(object, &ev);
                        if (ev.isAccepted() || ev.isAccepted(g))
                            break; // successfully delivered
                    }
                }
            }
        }
    }

    QGestureManager *gestureManager = QApplicationPrivate::instance()->gestureManager;
    Q_ASSERT(gestureManager); // it would be very odd if we got called without a manager.
    for (setIter = canceledGestures.begin(); setIter != canceledGestures.end(); ++setIter) {
        gestureManager->recycle(*setIter);
        gestureTargets.remove(*setIter);
    }
}